

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_hamt_map.cpp
# Opt level: O0

void __thiscall
OneLevel_InsertOfExistingKeyDoesNotResultInHeapNode_Test::
~OneLevel_InsertOfExistingKeyDoesNotResultInHeapNode_Test
          (OneLevel_InsertOfExistingKeyDoesNotResultInHeapNode_Test *this)

{
  OneLevel_InsertOfExistingKeyDoesNotResultInHeapNode_Test *this_local;
  
  ~OneLevel_InsertOfExistingKeyDoesNotResultInHeapNode_Test(this);
  operator_delete(this,0x168);
  return;
}

Assistant:

TEST_F (OneLevel, InsertOfExistingKeyDoesNotResultInHeapNode) {
    transaction_type t1 = begin (db_, lock_guard{mutex_});
    index_->insert (t1, test_trie::value_type{"a", "a"});
    index_->insert (t1, test_trie::value_type{"b", "b"});
    index_->flush (t1, db_.get_current_revision ());

    EXPECT_FALSE (index_->root ().is_heap ());

    index_->insert (t1, test_trie::value_type{"a", "a2"});
    EXPECT_FALSE (index_->root ().is_heap ());
}